

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall FilteredLT::ignore_node(FilteredLT *this,int u)

{
  BoolView *pBVar1;
  bool bVar2;
  
  pBVar1 = (this->p->vs).data;
  if ((sat.assigns.data[(uint)pBVar1[(uint)u].v] != '\0') &&
     (bVar2 = BoolView::isFalse(pBVar1 + (uint)u), bVar2)) {
    return true;
  }
  return false;
}

Assistant:

bool FilteredLT::ignore_node(int u) {
	if (p->getNodeVar(u).isFixed() && p->getNodeVar(u).isFalse()) {
		return true;
	}
	return false;
}